

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatClause.c
# Opt level: O3

void Msat_ClausePrint(Msat_Clause_t *pC)

{
  uint uVar1;
  char *pcVar2;
  ulong uVar3;
  
  if (pC == (Msat_Clause_t *)0x0) {
    printf("NULL pointer");
  }
  else {
    uVar1 = *(uint *)&pC->field_0x4;
    if ((uVar1 & 1) != 0) {
      printf("Act = %.4f  ",(double)*(float *)((long)&pC[1].Num + (ulong)(uVar1 >> 1 & 0xfffc)));
      uVar1 = *(uint *)&pC->field_0x4;
    }
    if ((uVar1 & 0x1fff8) != 0) {
      uVar3 = 0;
      do {
        pcVar2 = "-";
        if (((&pC[1].Num)[uVar3] & 1U) == 0) {
          pcVar2 = "";
        }
        printf(" %s%d",pcVar2,(ulong)((&pC[1].Num)[uVar3] / 2 + 1));
        uVar3 = uVar3 + 1;
      } while (uVar3 < (*(uint *)&pC->field_0x4 >> 3 & 0x3fff));
    }
  }
  putchar(10);
  return;
}

Assistant:

void Msat_ClausePrint( Msat_Clause_t * pC )
{
    int i;
    if ( pC == NULL )
        printf( "NULL pointer" );
    else 
    {
        if ( pC->fLearned )
            printf( "Act = %.4f  ", Msat_ClauseReadActivity(pC) );
        for ( i = 0; i < (int)pC->nSize; i++ )
            printf( " %s%d", ((pC->pData[i]&1)? "-": ""),  pC->pData[i]/2 + 1 );
    }
    printf( "\n" );
}